

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall AsymmetricAlgorithm::signFinal(AsymmetricAlgorithm *this,ByteString *param_1)

{
  anon_enum_32 aVar1;
  
  aVar1 = this->currentOperation;
  if (aVar1 == SIGN) {
    this->currentOperation = NONE;
    this->currentPrivateKey = (PrivateKey *)0x0;
    this->currentMechanism = Unknown;
  }
  return aVar1 == SIGN;
}

Assistant:

bool AsymmetricAlgorithm::signFinal(ByteString& /*signature*/)
{
	if (currentOperation != SIGN)
	{
		return false;
	}

	currentOperation = NONE;
	currentPrivateKey = NULL;
	currentMechanism = AsymMech::Unknown;

	return true;
}